

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

_Bool SaveFileText(char *fileName,char *text)

{
  _Bool _Var1;
  int iVar2;
  FILE *__stream;
  char *text_00;
  
  if (fileName == (char *)0x0) {
    _Var1 = false;
    TraceLog(4,"FILEIO: File name provided is not valid");
  }
  else {
    if (saveFileText != (SaveFileTextCallback)0x0) {
      _Var1 = (*saveFileText)(fileName,text);
      return _Var1;
    }
    __stream = fopen(fileName,"wt");
    if (__stream == (FILE *)0x0) {
      _Var1 = false;
      TraceLog(4,"FILEIO: [%s] Failed to open text file",fileName);
    }
    else {
      iVar2 = fprintf(__stream,"%s",text);
      if (iVar2 < 0) {
        text_00 = "FILEIO: [%s] Failed to write text file";
        iVar2 = 4;
      }
      else {
        text_00 = "FILEIO: [%s] Text file saved successfully";
        iVar2 = 3;
      }
      TraceLog(iVar2,text_00,fileName);
      iVar2 = fclose(__stream);
      _Var1 = iVar2 == 0;
    }
  }
  return _Var1;
}

Assistant:

bool SaveFileText(const char *fileName, char *text)
{
    bool success = false;

    if (fileName != NULL)
    {
        if (saveFileText)
        {
            return saveFileText(fileName, text);
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "wt");

        if (file != NULL)
        {
            int count = fprintf(file, "%s", text);

            if (count < 0) TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to write text file", fileName);
            else TRACELOG(LOG_INFO, "FILEIO: [%s] Text file saved successfully", fileName);

            int result = fclose(file);
            if (result == 0) success = true;
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open text file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return success;
}